

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfers.c
# Opt level: O1

int equal_transfer(transfer_t *a,transfer_t *b)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = strcmp(a->from_stop_id,b->from_stop_id);
  uVar2 = 0;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->to_stop_id,b->to_stop_id);
    if ((iVar1 == 0) && (a->transfer_type == b->transfer_type)) {
      uVar2 = (uint)(a->min_transfer_time == b->min_transfer_time);
    }
  }
  return uVar2;
}

Assistant:

int equal_transfer(const transfer_t *a, const transfer_t *b) {
    return (!strcmp(a->from_stop_id, b->from_stop_id) &&
             !strcmp(a->to_stop_id, b->to_stop_id) &&
             a->transfer_type == b->transfer_type &&
             a->min_transfer_time == b->min_transfer_time);
}